

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureDescription::Clear(FeatureDescription *this)

{
  FeatureType *this_00;
  Arena *pAVar1;
  uint32_t cached_has_bits;
  FeatureDescription *this_local;
  
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->name_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->shortdescription_);
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->type_ != (FeatureType *)0x0)) &&
     (this_00 = this->type_, this_00 != (FeatureType *)0x0)) {
    FeatureType::~FeatureType(this_00);
    operator_delete(this_00,0x28);
  }
  this->type_ = (FeatureType *)0x0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void FeatureDescription::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.FeatureDescription)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  name_.ClearToEmpty();
  shortdescription_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}